

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendBuildInterfaceIncludes(cmTarget *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var3;
  cmMakefile *this_00;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  long *plVar7;
  size_type *psVar8;
  string dirs;
  string local_c0;
  optional<cmListFileBacktrace> local_a0;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar2 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  if ((((uVar2 < 8) && ((0x8eU >> (uVar2 & 0x1f) & 1) != 0)) ||
      (bVar5 = IsExecutableWithExports(this), bVar5)) &&
     (_Var3._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl,
     (_Var3._M_head_impl)->BuildInterfaceIncludesAppended == false)) {
    (_Var3._M_head_impl)->BuildInterfaceIncludesAppended = true;
    this_00 = (_Var3._M_head_impl)->Makefile;
    paVar1 = &local_c0.field_2;
    local_c0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_c0,"CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE","");
    bVar5 = cmMakefile::IsOn(this_00,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if (bVar5) {
      psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      pcVar4 = (psVar6->_M_dataplus)._M_p;
      local_c0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar4,pcVar4 + psVar6->_M_string_length);
      if (local_c0._M_string_length != 0) {
        std::__cxx11::string::push_back((char)&local_c0);
      }
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_
                         (((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Makefile);
      std::__cxx11::string::_M_append((char *)&local_c0,(ulong)(psVar6->_M_dataplus)._M_p);
      if (local_c0._M_string_length != 0) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES","");
        std::operator+(&local_48,"$<BUILD_INTERFACE:",&local_c0);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_48);
        psVar8 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_88.field_2._M_allocated_capacity = *psVar8;
          local_88.field_2._8_8_ = plVar7[3];
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        }
        else {
          local_88.field_2._M_allocated_capacity = *psVar8;
          local_88._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_88._M_string_length = plVar7[1];
        *plVar7 = (long)psVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
        super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
        super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false;
        AppendProperty(this,&local_68,&local_88,&local_a0,false);
        if ((local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
             super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
             super__Optional_payload_base<cmListFileBacktrace>._M_engaged == true) &&
           (local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
            super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
            super__Optional_payload_base<cmListFileBacktrace>._M_engaged = false,
           local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
           super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
           super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
           super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
           super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a0.super__Optional_base<cmListFileBacktrace,_false,_false>._M_payload.
                     super__Optional_payload<cmListFileBacktrace,_true,_false,_false>.
                     super__Optional_payload_base<cmListFileBacktrace>._M_payload._M_value.
                     super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                     super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return;
}

Assistant:

void cmTarget::AppendBuildInterfaceIncludes()
{
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      !this->IsExecutableWithExports()) {
    return;
  }
  if (this->impl->BuildInterfaceIncludesAppended) {
    return;
  }
  this->impl->BuildInterfaceIncludesAppended = true;

  if (this->impl->Makefile->IsOn("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")) {
    std::string dirs = this->impl->Makefile->GetCurrentBinaryDirectory();
    if (!dirs.empty()) {
      dirs += ';';
    }
    dirs += this->impl->Makefile->GetCurrentSourceDirectory();
    if (!dirs.empty()) {
      this->AppendProperty("INTERFACE_INCLUDE_DIRECTORIES",
                           ("$<BUILD_INTERFACE:" + dirs + ">"));
    }
  }
}